

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# case.c
# Opt level: O2

void lcase(char *cp)

{
  char cVar1;
  char cVar2;
  
  if (cp != (char *)0x0) {
    for (; cVar1 = *cp, cVar1 != '\0'; cp = cp + 1) {
      cVar2 = cVar1 + ' ';
      if (0x19 < (byte)(cVar1 + 0xbfU)) {
        cVar2 = cVar1;
      }
      *cp = cVar2;
    }
  }
  return;
}

Assistant:

void
lcase(register char *cp)
{
    if (cp) {
        while (*cp) {
            *cp = LOWER_CASE(*cp);
            cp++;
        }
    }
}